

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O1

void gam_LocationF(int proc,Integer g_handle,Integer *subscript,char **ptr_loc,Integer *ld)

{
  ushort uVar1;
  int iVar2;
  C_Integer *pCVar3;
  global_array_t *pgVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int _ndim;
  ulong uVar9;
  long lVar10;
  C_Integer CVar11;
  long lVar12;
  long lVar13;
  Integer _hi [7];
  Integer _lo [7];
  int _index [7];
  long local_1b8 [7];
  long alStack_180 [9];
  int local_138 [66];
  
  uVar1 = GA[g_handle].ndim;
  uVar9 = (ulong)(short)uVar1;
  iVar6 = GA[g_handle].distr_type;
  if (iVar6 - 1U < 3) {
    uVar7 = (long)proc % GA[g_handle].num_blocks[0];
    local_138[0] = (int)uVar7;
    if (1 < (short)uVar1) {
      uVar7 = uVar7 & 0xffffffff;
      lVar12 = 0;
      uVar5 = (ulong)(uint)proc;
      do {
        uVar5 = (long)((int)uVar5 - (int)uVar7) / GA[g_handle].num_blocks[lVar12];
        uVar7 = (long)(int)uVar5 % GA[g_handle].num_blocks[lVar12 + 1];
        local_138[lVar12 + 1] = (int)uVar7;
        lVar12 = lVar12 + 1;
      } while ((uVar9 & 0xffffffff) - 1 != lVar12);
    }
    if (0 < (short)uVar1) {
      uVar7 = 0;
      do {
        iVar6 = local_138[uVar7];
        lVar12 = GA[g_handle].block_dims[uVar7];
        alStack_180[uVar7 + 1] = lVar12 * iVar6 + 1;
        lVar12 = ((long)iVar6 + 1) * lVar12;
        local_1b8[uVar7] = lVar12;
        if (GA[g_handle].dims[uVar7] <= lVar12) {
          lVar12 = GA[g_handle].dims[uVar7];
        }
        local_1b8[uVar7] = lVar12;
        uVar7 = uVar7 + 1;
      } while ((uVar9 & 0xffffffff) != uVar7);
    }
    goto LAB_0012ff3a;
  }
  if (iVar6 == 4) {
    uVar7 = (long)proc % GA[g_handle].num_blocks[0];
    local_138[0] = (int)uVar7;
    if (1 < (short)uVar1) {
      uVar7 = uVar7 & 0xffffffff;
      lVar12 = 0;
      uVar5 = (ulong)(uint)proc;
      do {
        uVar5 = (long)((int)uVar5 - (int)uVar7) / GA[g_handle].num_blocks[lVar12];
        uVar7 = (long)(int)uVar5 % GA[g_handle].num_blocks[lVar12 + 1];
        local_138[lVar12 + 1] = (int)uVar7;
        lVar12 = lVar12 + 1;
      } while ((uVar9 & 0xffffffff) - 1 != lVar12);
    }
    if (0 < (short)uVar1) {
      pCVar3 = GA[g_handle].mapc;
      uVar7 = 0;
      iVar6 = 0;
      do {
        iVar2 = local_138[uVar7];
        lVar12 = (long)iVar6 + (long)iVar2;
        alStack_180[uVar7 + 1] = pCVar3[lVar12];
        if ((long)iVar2 < GA[g_handle].num_blocks[uVar7] + -1) {
          CVar11 = GA[g_handle].mapc[lVar12 + 1] + -1;
        }
        else {
          CVar11 = GA[g_handle].dims[uVar7];
        }
        local_1b8[uVar7] = CVar11;
        iVar6 = iVar6 + (int)GA[g_handle].num_blocks[uVar7];
        uVar7 = uVar7 + 1;
      } while ((uVar9 & 0xffffffff) != uVar7);
    }
    goto LAB_0012ff3a;
  }
  if (iVar6 != 0) goto LAB_0012ff3a;
  if (GA[g_handle].num_rstrctd == 0) {
    if ((short)uVar1 < 1) {
      lVar12 = 1;
    }
    else {
      lVar12 = 1;
      uVar7 = 0;
      do {
        lVar12 = lVar12 * GA[g_handle].nblock[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar9 != uVar7);
    }
    if ((-1 < proc) && (proc < lVar12)) {
      if (0 < (short)uVar1) {
        pCVar3 = GA[g_handle].mapc;
        uVar7 = 0;
        lVar8 = 0;
        lVar12 = (long)proc;
        do {
          lVar13 = (long)GA[g_handle].nblock[uVar7];
          lVar10 = lVar12 % lVar13;
          alStack_180[uVar7 + 1] = pCVar3[lVar10 + lVar8];
          if (lVar10 == lVar13 + -1) {
            CVar11 = GA[g_handle].dims[uVar7];
          }
          else {
            CVar11 = pCVar3[lVar10 + lVar8 + 1] + -1;
          }
          lVar8 = lVar8 + lVar13;
          local_1b8[uVar7] = CVar11;
          uVar7 = uVar7 + 1;
          lVar12 = lVar12 / lVar13;
        } while (uVar9 != uVar7);
      }
      goto LAB_0012ff3a;
    }
LAB_0012ff04:
    if ((short)uVar1 < 1) goto LAB_0012ff3a;
    memset(alStack_180 + 1,0,uVar9 * 8);
  }
  else {
    lVar12 = (long)proc;
    if (lVar12 < GA[g_handle].num_rstrctd) {
      if ((short)uVar1 < 1) {
        lVar8 = 1;
      }
      else {
        lVar8 = 1;
        uVar7 = 0;
        do {
          lVar8 = lVar8 * GA[g_handle].nblock[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar9 != uVar7);
      }
      if ((-1 < proc) && (lVar12 < lVar8)) {
        if (0 < (short)uVar1) {
          pCVar3 = GA[g_handle].mapc;
          lVar8 = 0;
          uVar7 = 0;
          do {
            lVar13 = (long)GA[g_handle].nblock[uVar7];
            lVar10 = lVar12 % lVar13;
            alStack_180[uVar7 + 1] = pCVar3[lVar10 + lVar8];
            if (lVar10 == lVar13 + -1) {
              CVar11 = GA[g_handle].dims[uVar7];
            }
            else {
              CVar11 = pCVar3[lVar10 + lVar8 + 1] + -1;
            }
            lVar8 = lVar8 + lVar13;
            local_1b8[uVar7] = CVar11;
            uVar7 = uVar7 + 1;
            lVar12 = lVar12 / lVar13;
          } while (uVar9 != uVar7);
        }
        goto LAB_0012ff3a;
      }
      goto LAB_0012ff04;
    }
    if ((short)uVar1 < 1) goto LAB_0012ff3a;
    memset(alStack_180 + 1,0,(ulong)uVar1 << 3);
  }
  memset(local_1b8,0xff,uVar9 * 8);
LAB_0012ff3a:
  if (0 < GA[g_handle].ndim) {
    uVar7 = 0;
    do {
      lVar12 = subscript[uVar7];
      if ((lVar12 < alStack_180[uVar7 + 1]) || (local_1b8[uVar7] < lVar12)) {
        sprintf((char *)local_138,"check subscript failed:%ld not in (%ld:%ld) dim=%d",lVar12,
                alStack_180[uVar7 + 1],local_1b8[uVar7],uVar7 & 0xffffffff);
        pnga_error((char *)local_138,uVar7);
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)GA[g_handle].ndim);
  }
  pgVar4 = GA;
  if (uVar9 == 1) {
    *ld = (local_1b8[0] - alStack_180[1]) + GA[g_handle].width[0] * 2 + 1;
  }
  if ((short)uVar1 < 2) {
    lVar12 = 1;
    lVar8 = 0;
  }
  else {
    lVar12 = 1;
    lVar8 = 0;
    lVar10 = 0;
    do {
      lVar8 = lVar8 + ((pgVar4[g_handle].width[lVar10] + subscript[lVar10]) -
                      alStack_180[lVar10 + 1]) * lVar12;
      lVar13 = ((pgVar4[g_handle].width[lVar10] * 2 + 1) - alStack_180[lVar10 + 1]) +
               local_1b8[lVar10];
      ld[lVar10] = lVar13;
      lVar12 = lVar12 * lVar13;
      lVar10 = lVar10 + 1;
    } while (uVar9 - 1 != lVar10);
  }
  if (pgVar4[g_handle].p_handle == 0) {
    CVar11 = (C_Integer)PGRP_LIST->inv_map_proc_list[proc];
  }
  else if (pgVar4[g_handle].num_rstrctd == 0) {
    CVar11 = (C_Integer)proc;
  }
  else {
    CVar11 = pgVar4[g_handle].rstrctd_list[proc];
  }
  *ptr_loc = pgVar4[g_handle].ptr[CVar11] +
             (long)pgVar4[g_handle].elemsize *
             (((subscript[uVar9 - 1] - alStack_180[uVar9]) + pgVar4[g_handle].width[uVar9 - 1]) *
              lVar12 + lVar8);
  return;
}

Assistant:

void gam_LocationF(int proc, Integer g_handle,  Integer subscript[],
    char **ptr_loc, Integer ld[])
{                                                                          
  Integer _offset=0, _d, _w, _factor=1, _last=GA[g_handle].ndim-1;         
  Integer _lo[MAXDIM], _hi[MAXDIM], _pinv, _p_handle;                     
                                                                           
  ga_ownsM(g_handle, proc, _lo, _hi);                                      
  gaCheckSubscriptM(subscript, _lo, _hi, GA[g_handle].ndim);               
  if(_last==0) ld[0]=_hi[0]- _lo[0]+1+2*(Integer)GA[g_handle].width[0];   
  for(_d=0; _d < _last; _d++)            {                                 
    _w = (Integer)GA[g_handle].width[_d];                                  
    _offset += (subscript[_d]-_lo[_d]+_w) * _factor;                       
    ld[_d] = _hi[_d] - _lo[_d] + 1 + 2*_w;                                 
    _factor *= ld[_d];                                                     
  }                                                                        
  _offset += (subscript[_last]-_lo[_last]                                  
      + (Integer)GA[g_handle].width[_last])                                
  * _factor;                                                               
  _p_handle = GA[g_handle].p_handle;                                       
  if (_p_handle != 0) {                                                    
    if (GA[g_handle].num_rstrctd == 0) {                                   
      _pinv = proc;                                                        
    } else {                                                               
      _pinv = GA[g_handle].rstrctd_list[proc];                             
    }                                                                      
  } else {                                                                 
    _pinv = PGRP_LIST[_p_handle].inv_map_proc_list[proc];                  
  }                                                                       
  *(ptr_loc) =  GA[g_handle].ptr[_pinv]+_offset*GA[g_handle].elemsize;    
}